

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O0

void __thiscall ut_raw::df_post_iterator_empty::test_method(df_post_iterator_empty *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined1 local_181;
  df_post_iterator local_180;
  df_post_iterator local_160;
  undefined1 local_139;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_128;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  undefined1 local_d9;
  df_post_iterator local_d8;
  df_post_iterator local_b8;
  undefined1 local_91;
  basic_cstring<const_char> local_90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_80;
  basic_cstring<const_char> local_58 [2];
  basic_cstring<const_char> local_38;
  undefined1 local_28 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t1;
  df_post_iterator_empty *this_local;
  
  t1._16_8_ = this;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_38,0xd3,local_58);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_80,plVar3,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::df_post_begin
              (&local_b8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::df_post_end
              (&local_d8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    local_91 = st_tree::detail::
               d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
               ::operator==(&local_b8,&local_d8);
    local_d9 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_80,&local_90,0xd3,1,2,&local_91,"t1.df_post_begin() == t1.df_post_end()",
               &local_d9,"true");
    st_tree::detail::
    d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~d1st_post_iterator(&local_d8);
    st_tree::detail::
    d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~d1st_post_iterator(&local_b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f0,0xd4,&local_100);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::df_post_begin
              (&local_160,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::df_post_end
              (&local_180,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    local_139 = st_tree::detail::
                d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
                ::operator!=(&local_160,&local_180);
    local_181 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_128,&local_138,0xd4,1,2,&local_139,"t1.df_post_begin() != t1.df_post_end()",
               &local_181,"false");
    st_tree::detail::
    d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~d1st_post_iterator(&local_180);
    st_tree::detail::
    d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~d1st_post_iterator(&local_160);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(df_post_iterator_empty) {
    tree<int> t1;
    BOOST_CHECK_EQUAL(t1.df_post_begin() == t1.df_post_end(), true);
    BOOST_CHECK_EQUAL(t1.df_post_begin() != t1.df_post_end(), false);
}